

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

int Js::JavascriptString::IndexOfUsingJmpTable
              (Boyer_Moore_Jump *jmpTable,char16 *inputStr,charcount_t len,char16 *searchStr,
              int searchLen,int position)

{
  char16 cVar1;
  char16 cVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char16 *pcVar7;
  size_t count;
  
  count = (size_t)searchLen;
  pcVar7 = inputStr + position + (count - 1);
  bVar3 = true;
  if (pcVar7 < inputStr + len) {
    cVar1 = searchStr[searchLen + -1];
    uVar5 = (ulong)jmpTable[(ushort)cVar1].shift;
    if (jmpTable[(ushort)cVar1].shift == 0) {
      uVar5 = (ulong)(uint)searchLen;
    }
    do {
      cVar2 = *pcVar7;
      if (cVar2 == cVar1) {
        iVar4 = PAL_wmemcmp(pcVar7 + (1 - count),searchStr,count);
        uVar6 = uVar5;
        if (iVar4 == 0) {
          bVar3 = false;
          goto LAB_00d13d93;
        }
      }
      else {
        uVar6 = count;
        if (((ushort)cVar2 < 0x80) &&
           (uVar6 = (ulong)jmpTable[(ushort)cVar2].shift, (ulong)jmpTable[(ushort)cVar2].shift == 0)
           ) {
          uVar6 = count;
        }
      }
      pcVar7 = pcVar7 + uVar6;
    } while (pcVar7 < inputStr + len);
    bVar3 = true;
  }
LAB_00d13d93:
  iVar4 = ((int)((ulong)((long)pcVar7 - (long)inputStr) >> 1) - searchLen) + 1;
  if (bVar3) {
    iVar4 = -1;
  }
  if (pcVar7 < inputStr + position) {
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int JavascriptString::IndexOfUsingJmpTable(JmpTable jmpTable, const char16* inputStr, charcount_t len, const char16* searchStr, int searchLen, int position)
    {
        int result = -1;

        const char16 searchLast = searchStr[searchLen-1];

        uint32 lMatchedJump = searchLen;
        if (jmpTable[searchLast].shift > 0)
        {
            lMatchedJump = jmpTable[searchLast].shift;
        }

        char16 const * p = inputStr + position + searchLen-1;
        WCHAR c;
        while(p < inputStr + len)
        {
            // first character match, keep checking
            if (*p == searchLast)
            {
                if ( wmemcmp(p-searchLen+1, searchStr, searchLen) == 0 )
                {
                    break;
                }
                p += lMatchedJump;
            }
            else
            {
                c = *p;
                if ( 0 == ( c & ~0x7f ) && jmpTable[c].shift != 0 )
                {
                    p += jmpTable[c].shift;
                }
                else
                {
                    p += searchLen;
                }
            }
        }

        if (p >= inputStr+position && p < inputStr + len)
        {
            result = (int)(p - inputStr) - searchLen + 1;
        }

        return result;
    }